

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_PC_StartLegacyConnectSyntaxSuccess_Test::TestBody
          (InterpreterTestSuite_PC_StartLegacyConnectSyntaxSuccess_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  undefined8 *puVar4;
  _Alloc_hider _Var5;
  Registry *pRVar6;
  Status SVar7;
  bool bVar8;
  TypedExpectation<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *pTVar9;
  char *pcVar10;
  Status local_4da;
  Status local_4d9;
  string local_4d8;
  string local_4b8;
  internal local_498 [8];
  undefined8 *local_490;
  string local_488;
  Value value;
  undefined1 local_418 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  _Alloc_hider local_3f0;
  char local_3e0 [16];
  string local_3d0;
  State local_3b0;
  State local_3ac;
  ByteArray local_3a8;
  ByteArray local_388;
  char *local_368;
  string local_360;
  string local_340;
  UnixTime local_320;
  UnixTime local_318;
  Error local_310;
  BorderRouter br;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  pRVar6 = ctx.mRegistry;
  value.mError._0_8_ = &value.mError.mMessage._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&value,"127.0.0.1","");
  local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418._0_8_ = &local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"1.1","");
  ot::commissioner::BorderAgent::State::State(&local_3ac,0,0,0,0,0);
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"net1","");
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"");
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"");
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"");
  local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"domain1","");
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  pcVar10 = "";
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"","");
  ot::commissioner::UnixTime::UnixTime(&local_318,0);
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&br,(string *)&value,0x4e21,&local_388,(string *)local_418,local_3ac,
             &local_4d8,1,&local_4b8,&local_488,(Timestamp)0x0,0,&local_3d0,&local_3a8,&local_340,
             '\0',0,&local_360,local_318,0x103f);
  local_4d9 = ot::commissioner::persistent_storage::Registry::Add(pRVar6,(BorderAgent *)&br);
  local_4da = kSuccess;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
            (local_498,
             "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
             ,"RegistryStatus::kSuccess",&local_4d9,&local_4da);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  if (local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._0_8_ != &local_408) {
    operator_delete((void *)local_418._0_8_);
  }
  if (local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
    operator_delete((void *)value.mError._0_8_);
  }
  puVar4 = local_490;
  if (local_498[0] == (internal)0x0) {
    testing::Message::Message((Message *)&br);
    if (local_490 != (undefined8 *)0x0) {
      pcVar10 = (char *)*local_490;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x3fd,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&br);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if (br._vptr_BorderRouter != (_func_int **)0x0) {
      (**(code **)(*br._vptr_BorderRouter + 8))();
    }
    if (local_490 == (undefined8 *)0x0) goto LAB_001632ba;
    if ((undefined8 *)*local_490 != local_490 + 2) {
      operator_delete((undefined8 *)*local_490);
    }
  }
  else {
    if (local_490 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_490 != local_490 + 2) {
        operator_delete((undefined8 *)*local_490);
      }
      operator_delete(puVar4);
    }
    pRVar6 = ctx.mRegistry;
    value.mError._0_8_ = &value.mError.mMessage._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)&value,"127.0.0.2","");
    local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_418._0_8_ = &local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"1.1","");
    ot::commissioner::BorderAgent::State::State(&local_3b0,0,0,0,0,0);
    local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"net2","");
    local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"");
    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"");
    local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"");
    local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"domain1","");
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    local_368 = "";
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_360);
    ot::commissioner::UnixTime::UnixTime(&local_320,0);
    pcVar10 = (char *)(ulong)(uint)local_3b0;
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&br,(string *)&value,0x4e21,&local_388,(string *)local_418,local_3b0,
               &local_4d8,2,&local_4b8,&local_488,(Timestamp)0x0,0,&local_3d0,&local_3a8,&local_340,
               '\0',0,&local_360,local_320,0x103f);
    local_4d9 = ot::commissioner::persistent_storage::Registry::Add(pRVar6,(BorderAgent *)&br);
    local_4da = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              (local_498,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
               ,"RegistryStatus::kSuccess",&local_4d9,&local_4da);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p);
    }
    if (local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      operator_delete(local_3d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
      operator_delete(local_4b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
      operator_delete(local_4d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._0_8_ != &local_408) {
      operator_delete((void *)local_418._0_8_);
    }
    if (local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
      operator_delete((void *)value.mError._0_8_);
    }
    if (local_498[0] != (internal)0x0) {
      if (local_490 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_490 != local_490 + 2) {
          operator_delete((undefined8 *)*local_490);
        }
        operator_delete(local_490);
      }
      ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&br);
      ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&value,0);
      br.mNetworkId.mId = value.mError.mCode;
      SVar7 = ot::commissioner::persistent_storage::Registry::SetCurrentNetwork(ctx.mRegistry,&br);
      local_418[0] = SVar7;
      local_4d8._M_dataplus._M_p = local_4d8._M_dataplus._M_p & 0xffffffffffffff00;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                ((internal *)&value,"ctx.mRegistry->SetCurrentNetwork(br)",
                 "RegistryStatus::kSuccess",local_418,(Status *)&local_4d8);
      if ((undefined1)value.mError.mCode == kNone) {
        testing::Message::Message((Message *)local_418);
        if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = *(char **)value.mError.mMessage._M_dataplus._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_4d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x406,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_4d8,(Message *)local_418);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_418._0_8_ + 8))();
        }
        _Var5._M_p = value.mError.mMessage._M_dataplus._M_p;
        if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
          if (*value.mError.mMessage._M_dataplus._M_p !=
              value.mError.mMessage._M_dataplus._M_p + 0x10) {
            operator_delete(*value.mError.mMessage._M_dataplus._M_p);
          }
          operator_delete(_Var5._M_p);
        }
      }
      else {
        if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
          if (*value.mError.mMessage._M_dataplus._M_p !=
              value.mError.mMessage._M_dataplus._M_p + 0x10) {
            operator_delete(*value.mError.mMessage._M_dataplus._M_p);
          }
          operator_delete(value.mError.mMessage._M_dataplus._M_p);
        }
        local_4d8._M_string_length = (size_type)operator_new(8);
        (((MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *)local_4d8._M_string_length)->super_MatcherDescriberInterface).
        _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherDescriberInterface_003995b8;
        local_4d8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_003968b0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<testing::MatcherInterface<std::__cxx11::string_const&>const*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_4d8.field_2._M_allocated_capacity,
                   (MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)local_4d8._M_string_length);
        local_4d8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00396868;
        local_4b8._M_string_length = (size_type)operator_new(8);
        (((MatcherInterface<const_unsigned_short_&> *)local_4b8._M_string_length)->
        super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
             (_func_int **)&PTR__MatcherDescriberInterface_00399670;
        local_4b8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00396a78;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<testing::MatcherInterface<unsigned_short_const&>const*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_4b8.field_2._M_allocated_capacity,
                   (MatcherInterface<const_unsigned_short_&> *)local_4b8._M_string_length);
        local_4b8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00396a30;
        CommissionerAppMock::gmock_Connect
                  ((MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                    *)&value,
                   ctx.mDefaultCommissionerObject.
                   super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)&local_4d8,(Matcher<unsigned_short> *)&local_4b8);
        testing::internal::GetWithoutMatchers();
        pTVar9 = testing::internal::
                 MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                 ::InternalExpectedAt
                           ((MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                             *)&value,
                            "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                            ,0x408,"*ctx.mDefaultCommissionerObject","Connect(_, _)");
        pTVar9 = testing::internal::
                 TypedExpectation<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                 ::Times(pTVar9,1);
        paVar1 = &local_310.mMessage.field_2;
        local_310.mCode = kNone;
        local_310.mMessage._M_string_length = 0;
        local_310.mMessage.field_2._M_local_buf[0] = '\0';
        local_310.mMessage._M_dataplus._M_p = (pointer)paVar1;
        testing::Return<ot::commissioner::Error>((testing *)&local_488,&local_310);
        testing::internal::ReturnAction::operator_cast_to_Action
                  ((Action<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                    *)local_418,(ReturnAction *)&local_488);
        testing::internal::
        TypedExpectation<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
        ::WillRepeatedly(pTVar9,(Action<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                 *)local_418);
        if ((code *)local_408._M_allocated_capacity != (code *)0x0) {
          (*(code *)local_408._M_allocated_capacity)(local_418,local_418,3);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_488._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_488._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310.mMessage._M_dataplus._M_p != paVar1) {
          operator_delete(local_310.mMessage._M_dataplus._M_p);
        }
        value.mError.mMessage.field_2._8_8_ = &PTR__MatcherBase_003968b0;
        if (value.mData._M_string_length != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value.mData._M_string_length);
        }
        value.mError.mMessage._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00396a78;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                     value.mError.mMessage.field_2._M_local_buf[0]) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                              value.mError.mMessage.field_2._M_local_buf[0]));
        }
        local_4b8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00396a78;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b8.field_2._M_allocated_capacity
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_4b8.field_2._M_allocated_capacity);
        }
        local_4d8._M_dataplus._M_p = (pointer)&PTR__MatcherBase_003968b0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8.field_2._M_allocated_capacity
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_4d8.field_2._M_allocated_capacity);
        }
        local_4b8.field_2._M_allocated_capacity = 0;
        local_4b8._M_dataplus._M_p = (pointer)0x0;
        local_4b8._M_string_length = 0;
        paVar1 = &value.mError.mMessage.field_2;
        value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
        value.mError.mMessage._M_string_length = 0;
        value.mError.mMessage.field_2._M_local_buf[0] = '\0';
        paVar2 = &value.mData.field_2;
        value.mData._M_string_length = 0;
        value.mData.field_2._M_local_buf[0] = '\0';
        local_418._0_8_ = &local_408;
        value.mError.mMessage._M_dataplus._M_p = (pointer)paVar1;
        value.mData._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_418,"start 127.0.0.1 20001 --connect-only","");
        ot::commissioner::Interpreter::ParseExpression
                  ((Expression *)&local_488,&ctx.mInterpreter,(string *)local_418);
        local_4d8.field_2._M_allocated_capacity = local_4b8.field_2._M_allocated_capacity;
        local_4d8._M_string_length = local_4b8._M_string_length;
        local_4d8._M_dataplus._M_p = local_4b8._M_dataplus._M_p;
        local_4b8.field_2._M_allocated_capacity = local_488.field_2._M_allocated_capacity;
        local_4b8._M_dataplus._M_p = local_488._M_dataplus._M_p;
        local_4b8._M_string_length = local_488._M_string_length;
        local_488._M_dataplus._M_p = (pointer)0x0;
        local_488._M_string_length = 0;
        local_488.field_2._M_allocated_capacity = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_4d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_488);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._0_8_ != &local_408) {
          operator_delete((void *)local_418._0_8_);
        }
        ot::commissioner::Interpreter::Eval
                  ((Value *)local_418,&ctx.mInterpreter,(Expression *)&local_4b8);
        value.mError.mCode = local_418._0_4_;
        std::__cxx11::string::operator=((string *)&value.mError.mMessage,(string *)(local_418 + 8));
        std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_3f0);
        if (local_3f0._M_p != local_3e0) {
          operator_delete(local_3f0._M_p);
        }
        if ((char *)local_418._8_8_ != local_408._M_local_buf + 8) {
          operator_delete((void *)local_418._8_8_);
        }
        bVar8 = ot::commissioner::Interpreter::Value::HasNoError(&value);
        local_4d8._M_dataplus._M_p._0_1_ = bVar8;
        local_4d8._M_string_length = 0;
        if (!bVar8) {
          testing::Message::Message((Message *)&local_488);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_418,(internal *)&local_4d8,(AssertionResult *)0x2ddeee,"false",
                     "true",pcVar10);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_3d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x40e,(char *)local_418._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_3d0,(Message *)&local_488);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._0_8_ != &local_408) {
            operator_delete((void *)local_418._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_488._M_dataplus._M_p + 8))();
          }
          sVar3 = local_4d8._M_string_length;
          if ((undefined8 *)local_4d8._M_string_length != (undefined8 *)0x0) {
            if (*(undefined8 **)local_4d8._M_string_length !=
                (undefined8 *)(local_4d8._M_string_length + 0x10)) {
              operator_delete(*(undefined8 **)local_4d8._M_string_length);
            }
            operator_delete((void *)sVar3);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)value.mData._M_dataplus._M_p != paVar2) {
          operator_delete(value.mData._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)value.mError.mMessage._M_dataplus._M_p != paVar1) {
          operator_delete(value.mError.mMessage._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_4b8);
      }
      br._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_00395f58;
      ot::commissioner::BorderAgent::~BorderAgent(&br.mAgent);
      goto LAB_001632ba;
    }
    testing::Message::Message((Message *)&br);
    if (local_490 != (undefined8 *)0x0) {
      local_368 = (char *)*local_490;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x402,local_368);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&br);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if (br._vptr_BorderRouter != (_func_int **)0x0) {
      (**(code **)(*br._vptr_BorderRouter + 8))();
    }
    if (local_490 == (undefined8 *)0x0) goto LAB_001632ba;
    if ((undefined8 *)*local_490 != local_490 + 2) {
      operator_delete((undefined8 *)*local_490);
    }
  }
  operator_delete(local_490);
LAB_001632ba:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_StartLegacyConnectSyntaxSuccess)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);

    BorderRouter br;
    br.mNetworkId = 0;
    ASSERT_EQ(ctx.mRegistry->SetCurrentNetwork(br), RegistryStatus::kSuccess);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, Connect(_, _)).Times(1).WillRepeatedly(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;
    expr  = ctx.mInterpreter.ParseExpression("start 127.0.0.1 20001 --connect-only");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}